

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::replicate(SVInt *this,SVInt *times)

{
  uint *puVar1;
  iterator __last;
  undefined8 extraout_RDX;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar2;
  size_t i;
  SmallVector<slang::SVInt,_2UL> buffer;
  uint32_t n;
  SVInt *in_stack_ffffffffffffff48;
  SmallVector<slang::SVInt,_2UL> *this_00;
  SmallVectorBase<slang::SVInt> *in_stack_ffffffffffffff50;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_01;
  ulong local_70;
  SmallVector<slang::SVInt,_2UL> local_60;
  _Optional_payload_base<unsigned_int> local_24;
  uint local_1c;
  
  this_01 = in_RDI;
  local_24 = (_Optional_payload_base<unsigned_int>)as<unsigned_int>(in_RSI);
  puVar1 = std::optional<unsigned_int>::value((optional<unsigned_int> *)in_stack_ffffffffffffff50);
  local_1c = *puVar1;
  SmallVector<slang::SVInt,_2UL>::SmallVector(&local_60,local_1c);
  for (local_70 = 0; local_70 < local_1c; local_70 = local_70 + 1) {
    SmallVectorBase<slang::SVInt>::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  this_00 = &local_60;
  __last = SmallVectorBase<slang::SVInt>::begin(&this_00->super_SmallVectorBase<slang::SVInt>);
  SmallVectorBase<slang::SVInt>::end(&this_00->super_SmallVectorBase<slang::SVInt>);
  std::span<const_slang::SVInt,_18446744073709551615UL>::span<slang::SVInt_*,_slang::SVInt_*>
            ((span<const_slang::SVInt,_18446744073709551615UL> *)this_01.pVal,(SVInt *)in_RDI.pVal,
             __last);
  concat((span<const_slang::SVInt,_18446744073709551615UL>)
         buffer.super_SmallVectorBase<slang::SVInt>.firstElement);
  SmallVector<slang::SVInt,_2UL>::~SmallVector((SmallVector<slang::SVInt,_2UL> *)0x2a3e3c);
  SVar2.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar2.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar2.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar2.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar2.super_SVIntStorage.field_0.val = this_01.val;
  return (SVInt)SVar2.super_SVIntStorage;
}

Assistant:

SVInt SVInt::replicate(const SVInt& times) const {
    uint32_t n = times.as<uint32_t>().value();
    SmallVector<SVInt> buffer(n, UninitializedTag());
    for (size_t i = 0; i < n; ++i)
        buffer.push_back(*this);
    return concat(std::span<SVInt const>(buffer.begin(), buffer.end()));
}